

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,int __fd
     ,void *__buf,size_t __n)

{
  ulong uVar1;
  buffer<char> *this_00;
  size_t sVar2;
  int iVar3;
  buffer<char> *__n_00;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> bVar4;
  undefined4 extraout_var;
  void *pvVar5;
  format_error *this_01;
  undefined4 in_register_00000034;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> out;
  basic_format_specs<char> *in_R8;
  buffer<char> *c;
  basic_string_view<char> s;
  
  out.container._4_4_ = in_register_00000034;
  out.container._0_4_ = __fd;
  if (out.container == (buffer<char> *)0x0) {
    this_01 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_01,"string pointer is null");
    __cxa_throw(this_01,&format_error::typeinfo,format_error::~format_error);
  }
  __n_00 = (buffer<char> *)strlen(out.container);
  this_00 = (this->out_).container;
  if (this->specs_ == (format_specs *)0x0) {
    sVar2 = this_00->size_;
    uVar1 = (long)&__n_00->_vptr_buffer + sVar2;
    bVar4.container = __n_00;
    if (this_00->capacity_ < uVar1) {
      iVar3 = (**this_00->_vptr_buffer)(this_00,uVar1);
      bVar4.container = (buffer<char> *)CONCAT44(extraout_var,iVar3);
    }
    this_00->size_ = uVar1;
    if (__n_00 != (buffer<char> *)0x0) {
      pvVar5 = memmove(this_00->ptr_ + sVar2,out.container,(size_t)__n_00);
      return (ssize_t)pvVar5;
    }
  }
  else {
    s.size_ = (size_t)this->specs_;
    s.data_ = (char *)__n_00;
    bVar4 = write<char,char,std::back_insert_iterator<fmt::v6::detail::buffer<char>>>
                      (this_00,out,s,in_R8);
    (this->out_).container = bVar4.container;
  }
  return (ssize_t)bVar4.container;
}

Assistant:

void write(const char_type* value) {
    if (!value) {
      FMT_THROW(format_error("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? write(sv, *specs_) : write(sv);
    }
  }